

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

void __thiscall QMdiAreaPrivate::_q_moveTab(QMdiAreaPrivate *this,int from,int to)

{
  ulong uVar1;
  long lVar2;
  Data *pDVar3;
  long lVar4;
  qsizetype qVar5;
  int iVar6;
  ulong uVar7;
  QObject *mdiChild;
  
  QList<QPointer<QMdiSubWindow>_>::move(&this->childWindows,(long)from,(long)to);
  qVar5 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QPointer<QMdiSubWindow>>
                    (&this->childWindows,&this->active,0);
  if ((int)qVar5 == -1) {
    return;
  }
  lVar2 = (this->indicesToActivatedChildren).d.size;
  iVar6 = -1;
  if (lVar2 != 0) {
    uVar7 = 0xfffffffffffffffc;
    do {
      if (lVar2 * -4 + uVar7 == -4) goto LAB_0043f96e;
      uVar1 = uVar7 + 4;
      lVar4 = uVar7 + 4;
      uVar7 = uVar1;
    } while (*(int *)((long)(this->indicesToActivatedChildren).d.ptr + lVar4) != (int)qVar5);
    if ((int)(uVar1 >> 2) == 0) {
      return;
    }
    iVar6 = (int)((long)uVar1 >> 2);
  }
LAB_0043f96e:
  mdiChild = (QObject *)0x0;
  QList<int>::move(&this->indicesToActivatedChildren,(long)iVar6,0);
  pDVar3 = (this->active).wp.d;
  if (pDVar3 != (Data *)0x0) {
    if (*(int *)(pDVar3 + 4) == 0) {
      mdiChild = (QObject *)0x0;
    }
    else {
      mdiChild = (this->active).wp.value;
    }
  }
  internalRaise(this,(QMdiSubWindow *)mdiChild);
  return;
}

Assistant:

void QMdiAreaPrivate::_q_moveTab(int from, int to)
{
#if !QT_CONFIG(tabbar)
    Q_UNUSED(from);
    Q_UNUSED(to);
#else
    childWindows.move(from, to);

    // Put the active window in front to update activation order.
    const int indexToActiveWindow = childWindows.indexOf(active);
    if (indexToActiveWindow != -1) {
        const int index = indicesToActivatedChildren.indexOf(indexToActiveWindow);
        Q_ASSERT(index != -1);
        if (index != 0) { // if it's not in front
            indicesToActivatedChildren.move(index, 0);
            internalRaise(active);
        }
    }
#endif // QT_CONFIG(tabbar)
}